

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiDockNode *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImDrawList *pIVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  ImGuiDockNode *node;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (window != (ImGuiWindow *)0x0) {
    bVar9 = window->WasActive;
    pIVar5 = GImGui->NavWindow;
    if (bVar9 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar16 = " *Inactive*";
    }
    else {
      pcVar16 = "";
    }
    bVar7 = TreeNodeEx(label,(uint)(pIVar5 == window),"%s \'%s\'%s",label,window->Name,pcVar16);
    if (bVar9 == false) {
      PopStyleColor(1);
    }
    bVar8 = IsItemHovered(0);
    if ((bVar8 & bVar9) == 1) {
      pIVar10 = GetViewportDrawList(window->Viewport,1,"##Foreground");
      local_88.y = (window->Pos).y + (window->Size).y;
      local_88.x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(pIVar10,&window->Pos,&local_88,0xff00ffff,0.0,0,1.0);
    }
    if (bVar7) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar12 = window->Flags;
      DebugNodeDrawList(window,window->Viewport,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 SUB84((double)(window->Pos).x,0),SUB84((double)(window->Pos).y,0),
                 SUB84((double)(window->Size).x,0),SUB84((double)(window->Size).y,0),
                 (double)(window->ContentSize).x,(double)(window->ContentSize).y,
                 (double)(window->ContentSizeIdeal).x,(double)(window->ContentSizeIdeal).y);
      pcVar22 = "";
      pcVar16 = "Child ";
      if ((uVar12 >> 0x18 & 1) == 0) {
        pcVar16 = "";
      }
      pcVar11 = "Tooltip ";
      if ((uVar12 >> 0x19 & 1) == 0) {
        pcVar11 = "";
      }
      pcVar14 = "Popup ";
      if ((uVar12 >> 0x1a & 1) == 0) {
        pcVar14 = "";
      }
      pcVar17 = "Modal ";
      if ((uVar12 >> 0x1b & 1) == 0) {
        pcVar17 = "";
      }
      pcVar18 = "ChildMenu ";
      if ((uVar12 >> 0x1c & 1) == 0) {
        pcVar18 = "";
      }
      pcVar19 = "NoSavedSettings ";
      if ((uVar12 >> 8 & 1) == 0) {
        pcVar19 = "";
      }
      pcVar23 = "NoMouseInputs";
      if ((uVar12 >> 9 & 1) == 0) {
        pcVar23 = "";
      }
      pcVar20 = "NoNavInputs";
      if ((uVar12 >> 0x12 & 1) == 0) {
        pcVar20 = "";
      }
      pcVar21 = "AlwaysAutoResize";
      if ((uVar12 & 0x40) == 0) {
        pcVar21 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar12,pcVar16,pcVar11,pcVar14,
                 pcVar17,pcVar18,pcVar19,pcVar23,pcVar20,pcVar21);
      BulletText("WindowClassId: 0x%08X",(ulong)(window->WindowClass).ClassId);
      pcVar16 = "X";
      if (window->ScrollbarX == false) {
        pcVar16 = "";
      }
      pcVar11 = "Y";
      if (window->ScrollbarY == false) {
        pcVar11 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",SUB84((double)(window->Scroll).x,0),
                 SUB84((double)(window->ScrollMax).x,0),SUB84((double)(window->Scroll).y,0),
                 SUB84((double)(window->ScrollMax).y,0),pcVar16,pcVar11);
      if ((window->Active != false) || (uVar15 = 0xffffffff, window->WasActive != false)) {
        uVar15 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar15)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar13 = 0x3b0;
      uVar15 = 0;
      do {
        fVar1 = *(float *)((long)window + lVar13 * 4 + -0xb08);
        fVar2 = *(float *)((long)window + lVar13 * 4 + -0xb04);
        fVar3 = *(float *)((long)window + lVar13 * 4 + -0xb00);
        fVar4 = *(float *)((long)window + lVar13 * 4 + -0xafc);
        if ((fVar1 < fVar4) || (fVar2 < fVar4)) {
          local_78 = ZEXT416((uint)fVar1);
          local_58 = ZEXT416((uint)fVar2);
          local_68 = ZEXT416((uint)fVar3);
          local_48 = ZEXT416((uint)fVar4);
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",SUB84((double)fVar1,0),
                     SUB84((double)fVar2,0),SUB84((double)fVar3,0),SUB84((double)fVar4,0),uVar15,
                     (ulong)*(uint *)((long)&window->Name + lVar13));
          bVar9 = IsItemHovered(0);
          if (bVar9) {
            pIVar10 = GetViewportDrawList(window->Viewport,1,"##Foreground");
            fVar1 = (window->Pos).x;
            fVar2 = (window->Pos).y;
            local_88.y = (float)local_58._0_4_ + fVar2;
            local_88.x = (float)local_78._0_4_ + fVar1;
            local_80.y = (float)local_48._0_4_ + fVar2;
            local_80.x = (float)local_68._0_4_ + fVar1;
            ImDrawList::AddRect(pIVar10,&local_88,&local_80,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",uVar15,(ulong)*(uint *)((long)&window->Name + lVar13))
          ;
        }
        lVar13 = lVar13 + 4;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (lVar13 == 0x3b4);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar16 = "NULL";
      }
      else {
        pcVar16 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar16);
      uVar12 = 0xffffffff;
      uVar15 = 0xffffffff;
      if (window->Viewport != (ImGuiViewportP *)0x0) {
        uVar15 = (ulong)*(uint *)&(window->Viewport->super_ImGuiViewport).field_0x5c;
      }
      if (window->ViewportOwned != false) {
        pcVar22 = " (Owned)";
      }
      BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)",
                 SUB84((double)(window->ViewportPos).x,0),SUB84((double)(window->ViewportPos).y,0),
                 uVar15,pcVar22,(ulong)window->ViewportId);
      if (window->Viewport != (ImGuiViewportP *)0x0) {
        uVar12 = (uint)window->Viewport->PlatformMonitor;
      }
      BulletText("ViewportMonitor: %d",(ulong)uVar12);
      BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d",(ulong)window->DockId,
                 (ulong)(uint)(int)window->DockOrder,(ulong)((byte)window->field_0x3e1 & 1),
                 (ulong)((byte)window->field_0x3e1 >> 2 & 1));
      if ((window->DockNode != (ImGuiDockNode *)0x0) ||
         (window->DockNodeAsHost != (ImGuiDockNode *)0x0)) {
        pIVar6 = window->DockNodeAsHost;
        node = window->DockNode;
        if (pIVar6 != (ImGuiDockNode *)0x0) {
          node = pIVar6;
        }
        pcVar16 = "DockNodeAsHost";
        if (pIVar6 == (ImGuiDockNode *)0x0) {
          pcVar16 = "DockNode";
        }
        DebugNodeDockNode(node,pcVar16);
      }
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->RootWindowDockTree != window->RootWindow) {
        DebugNodeWindow(window->RootWindowDockTree,"RootWindowDockTree");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar9 = TreeNode("Columns","Columns sets (%d)");
        if (bVar9) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar13 = 0;
            lVar24 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar13));
              lVar24 = lVar24 + 1;
              lVar13 = lVar13 + 0x88;
            } while (lVar24 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");

    BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
    BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
    BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
    if (window->DockNode || window->DockNodeAsHost)
        DebugNodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");

    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->RootWindowDockTree != window->RootWindow) { DebugNodeWindow(window->RootWindowDockTree, "RootWindowDockTree"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}